

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlm_gp.cpp
# Opt level: O3

void __thiscall
tlm::tlm_generic_payload::tlm_generic_payload(tlm_generic_payload *this,tlm_mm_interface *mm)

{
  tlm_extension_registry *ptVar1;
  size_type size;
  
  this->_vptr_tlm_generic_payload = (_func_int **)&PTR__tlm_generic_payload_0026ef98;
  this->m_address = 0;
  this->m_command = TLM_IGNORE_COMMAND;
  this->m_data = (uchar *)0x0;
  this->m_length = 0;
  this->m_response_status = TLM_INCOMPLETE_RESPONSE;
  this->m_dmi = false;
  this->m_byte_enable = (uchar *)0x0;
  this->m_byte_enable_length = 0;
  this->m_streaming_width = 0;
  this->m_gp_option = TLM_MIN_PAYLOAD;
  if ((anonymous_namespace)::tlm_extension_registry::instance_ == 0) {
    size = 0;
  }
  else {
    ptVar1 = anon_unknown_2::tlm_extension_registry::instance();
    size = (size_type)(uint)(ptVar1->ids_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  tlm_array<tlm::tlm_extension_base_*>::tlm_array(&this->m_extensions,size);
  this->m_mm = mm;
  this->m_ref_count = 0;
  return;
}

Assistant:

tlm_generic_payload::tlm_generic_payload(tlm_mm_interface* mm)
  : m_address(0)
  , m_command(TLM_IGNORE_COMMAND)
  , m_data(0)
  , m_length(0)
  , m_response_status(TLM_INCOMPLETE_RESPONSE)
  , m_dmi(false)
  , m_byte_enable(0)
  , m_byte_enable_length(0)
  , m_streaming_width(0)
  , m_gp_option(TLM_MIN_PAYLOAD)
  , m_extensions(max_num_extensions())
  , m_mm(mm)
  , m_ref_count(0)
{}